

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_bolt_message(mg_session *session,mg_message **message)

{
  mg_message *buf;
  int iVar1;
  mg_message_type mVar2;
  undefined8 in_RAX;
  char *fmt;
  uint8_t marker;
  uint8_t signature;
  undefined2 local_22;
  undefined2 uVar3;
  
  uVar3 = (undefined2)((ulong)in_RAX >> 0x38);
  iVar1 = mg_session_read_uint8(session,(uint8_t *)&local_22);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mg_session_read_uint8(session,(uint8_t *)((long)&local_22 + 1));
  if (iVar1 != 0) {
    return iVar1;
  }
  local_22 = uVar3;
  buf = (mg_message *)mg_allocator_malloc(session->decoder_allocator,0x10);
  if (buf == (mg_message *)0x0) {
    mg_session_set_error(session,"out of memory");
    return -3;
  }
  fmt = "unknown message type";
  if (0x3e < local_22._1_1_) {
    if (0x70 < local_22._1_1_) {
      if (local_22._1_1_ == 0x71) {
        if ((byte)local_22 == 0xb1) {
          buf->type = MG_MESSAGE_TYPE_RECORD;
          iVar1 = mg_session_read_record_message(session,&(buf->field_1).record_v);
          goto joined_r0x00107e1a;
        }
      }
      else {
        if (local_22._1_1_ != 0x7f) goto LAB_00107e25;
        if ((byte)local_22 == 0xb1) {
          buf->type = MG_MESSAGE_TYPE_FAILURE;
          iVar1 = mg_session_read_failure_message(session,&(buf->field_1).failure_v);
          goto joined_r0x00107e1a;
        }
      }
      goto LAB_00107e1e;
    }
    if (local_22._1_1_ == 0x3f) {
      if ((session->version == 4 | 0xb0U) == (byte)local_22) {
        buf->type = MG_MESSAGE_TYPE_PULL;
        iVar1 = mg_session_read_pull_message(session,&(buf->field_1).pull_v);
        goto joined_r0x00107e1a;
      }
      goto LAB_00107e1e;
    }
    if (local_22._1_1_ == 0x70) {
      if ((byte)local_22 == 0xb1) {
        buf->type = MG_MESSAGE_TYPE_SUCCESS;
        iVar1 = mg_session_read_success_message(session,&(buf->field_1).success_v);
        goto joined_r0x00107e1a;
      }
      goto LAB_00107e1e;
    }
    goto LAB_00107e25;
  }
  switch(local_22._1_1_) {
  case 0xe:
    mVar2 = MG_MESSAGE_TYPE_ACK_FAILURE;
    break;
  case 0xf:
    mVar2 = MG_MESSAGE_TYPE_RESET;
    break;
  case 0x10:
    if ((session->version == 4 | 0xb2U) != (byte)local_22) goto LAB_00107e1e;
    buf->type = MG_MESSAGE_TYPE_RUN;
    iVar1 = mg_session_read_run_message(session,&(buf->field_1).run_v);
joined_r0x00107e1a:
    if (iVar1 == 0) goto LAB_00107df5;
    goto LAB_00107e34;
  case 0x11:
    if ((byte)local_22 == 0xb1) {
      buf->type = MG_MESSAGE_TYPE_BEGIN;
      iVar1 = mg_session_read_begin_message(session,&(buf->field_1).begin_v);
      goto joined_r0x00107e1a;
    }
    goto LAB_00107e1e;
  case 0x12:
    mVar2 = MG_MESSAGE_TYPE_COMMIT;
    break;
  case 0x13:
    mVar2 = MG_MESSAGE_TYPE_ROLLBACK;
    break;
  default:
    if (local_22._1_1_ != 1) goto LAB_00107e25;
    if (session->version == 1) {
      if ((byte)local_22 == 0xb2) {
        buf->type = MG_MESSAGE_TYPE_INIT;
        iVar1 = mg_session_read_init_message(session,&(buf->field_1).init_v);
        goto joined_r0x00107e1a;
      }
    }
    else if ((byte)local_22 == 0xb1) {
      buf->type = MG_MESSAGE_TYPE_HELLO;
      iVar1 = mg_session_read_hello_message(session,&(buf->field_1).hello_v);
      goto joined_r0x00107e1a;
    }
    goto LAB_00107e1e;
  }
  if ((byte)local_22 == 0xb0) {
    buf->type = mVar2;
LAB_00107df5:
    *message = buf;
    iVar1 = 0;
  }
  else {
LAB_00107e1e:
    fmt = "wrong value marker";
LAB_00107e25:
    mg_session_set_error(session,fmt);
    iVar1 = -10;
LAB_00107e34:
    mg_allocator_free(session->decoder_allocator,buf);
  }
  return iVar1;
}

Assistant:

int mg_session_read_bolt_message(mg_session *session, mg_message **message) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));

  uint8_t signature;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &signature));

  mg_message *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  switch (signature) {
    case MG_SIGNATURE_MESSAGE_SUCCESS:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_SUCCESS;
      status = mg_session_read_success_message(session, &tmessage->success_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_FAILURE:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_FAILURE;
      status = mg_session_read_failure_message(session, &tmessage->failure_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RECORD:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RECORD;
      status = mg_session_read_record_message(session, &tmessage->record_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_HELLO:
      if (session->version == 1) {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 2)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_INIT;
        status = mg_session_read_init_message(session, &tmessage->init_v);
      } else {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_HELLO;
        status = mg_session_read_hello_message(session, &tmessage->hello_v);
      }
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RUN: {
      int field_number = 2 + (session->version == 4);
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + field_number)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RUN;
      status = mg_session_read_run_message(session, &tmessage->run_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    case MG_SIGNATURE_MESSAGE_ACK_FAILURE:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ACK_FAILURE;
      break;
    case MG_SIGNATURE_MESSAGE_BEGIN:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_BEGIN;
      status = mg_session_read_begin_message(session, &tmessage->begin_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_COMMIT:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_COMMIT;
      break;
    case MG_SIGNATURE_MESSAGE_ROLLBACK:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ROLLBACK;
      break;
    case MG_SIGNATURE_MESSAGE_RESET:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RESET;
      break;
    case MG_SIGNATURE_MESSAGE_PULL: {
      uint8_t expected_marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
      if (marker != expected_marker) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_PULL;
      status = mg_session_read_pull_message(session, &tmessage->pull_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    default:
      mg_session_set_error(session, "unknown message type");
      status = MG_ERROR_PROTOCOL_VIOLATION;
      goto cleanup;
  }

  *message = tmessage;
  return 0;

wrong_marker:
  mg_session_set_error(session, "wrong value marker");
  status = MG_ERROR_PROTOCOL_VIOLATION;
cleanup:
  mg_allocator_free(session->decoder_allocator, tmessage);
  return status;
}